

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O0

void ucnv_fixFileSeparator_63(UConverter *cnv,UChar *source,int32_t sourceLength)

{
  UChar UVar1;
  UAmbiguousConverter *pUVar2;
  int local_2c;
  UChar variant5c;
  int32_t i;
  UAmbiguousConverter *a;
  int32_t sourceLength_local;
  UChar *source_local;
  UConverter *cnv_local;
  
  if ((((cnv != (UConverter *)0x0) && (source != (UChar *)0x0)) && (0 < sourceLength)) &&
     (pUVar2 = ucnv_getAmbiguous(cnv), pUVar2 != (UAmbiguousConverter *)0x0)) {
    UVar1 = pUVar2->variant5c;
    for (local_2c = 0; local_2c < sourceLength; local_2c = local_2c + 1) {
      if (source[local_2c] == UVar1) {
        source[local_2c] = L'\\';
      }
    }
  }
  return;
}

Assistant:

U_CAPI void  U_EXPORT2
ucnv_fixFileSeparator(const UConverter *cnv, 
                      UChar* source, 
                      int32_t sourceLength) {
    const UAmbiguousConverter *a;
    int32_t i;
    UChar variant5c;

    if(cnv==NULL || source==NULL || sourceLength<=0 || (a=ucnv_getAmbiguous(cnv))==NULL)
    {
        return;
    }

    variant5c=a->variant5c;
    for(i=0; i<sourceLength; ++i) {
        if(source[i]==variant5c) {
            source[i]=0x5c;
        }
    }
}